

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::StructurePatternMemberSyntax::isKind(SyntaxKind kind)

{
  return kind == OrderedStructurePatternMember || kind == NamedStructurePatternMember;
}

Assistant:

bool StructurePatternMemberSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NamedStructurePatternMember:
        case SyntaxKind::OrderedStructurePatternMember:
            return true;
        default:
            return false;
    }
}